

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void absl::lts_20240722::container_internal::
     map_slot_policy<std::__cxx11::string,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>
     ::
     construct<std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>>>
               (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>
                *alloc,slot_type *slot,slot_type *other)

{
  slot_type *other_local;
  slot_type *slot_local;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>_>
  *alloc_local;
  
  map_slot_policy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,_std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>_>_>
  ::emplace(slot);
  std::
  allocator_traits<std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>>>
  ::
  construct<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>,std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node,std::default_delete<google::protobuf::util::(anonymous_namespace)::FieldMaskTree::Node>>>>
            (alloc,&slot->value,&other->value);
  return;
}

Assistant:

static void construct(Allocator* alloc, slot_type* slot, slot_type* other) {
    emplace(slot);
    if (kMutableKeys::value) {
      absl::allocator_traits<Allocator>::construct(
          *alloc, &slot->mutable_value, std::move(other->mutable_value));
    } else {
      absl::allocator_traits<Allocator>::construct(*alloc, &slot->value,
                                                   std::move(other->value));
    }
  }